

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defltprov.c
# Opt level: O0

int deflt_get_params(void *provctx,OSSL_PARAM *params)

{
  int iVar1;
  OSSL_PARAM *pOVar2;
  char *in_RDI;
  OSSL_PARAM *p;
  OSSL_PARAM *in_stack_ffffffffffffffd8;
  OSSL_PARAM *p_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pOVar2 = OSSL_PARAM_locate(in_stack_ffffffffffffffd8,(char *)0x2e71cf);
  if ((pOVar2 != (OSSL_PARAM *)0x0) &&
     (iVar1 = OSSL_PARAM_set_utf8_ptr
                        ((OSSL_PARAM *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                         ,in_RDI), iVar1 == 0)) {
    return 0;
  }
  pOVar2 = OSSL_PARAM_locate(in_stack_ffffffffffffffd8,(char *)0x2e7210);
  if ((pOVar2 != (OSSL_PARAM *)0x0) &&
     (iVar1 = OSSL_PARAM_set_utf8_ptr
                        ((OSSL_PARAM *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                         ,in_RDI), iVar1 == 0)) {
    return 0;
  }
  pOVar2 = OSSL_PARAM_locate(in_stack_ffffffffffffffd8,(char *)0x2e7251);
  if ((pOVar2 != (OSSL_PARAM *)0x0) &&
     (iVar1 = OSSL_PARAM_set_utf8_ptr
                        ((OSSL_PARAM *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                         ,in_RDI), iVar1 == 0)) {
    return 0;
  }
  pOVar2 = OSSL_PARAM_locate(in_stack_ffffffffffffffd8,(char *)0x2e728f);
  if (pOVar2 != (OSSL_PARAM *)0x0) {
    p_00 = pOVar2;
    ossl_prov_is_running();
    iVar1 = OSSL_PARAM_set_int(p_00,(int)((ulong)pOVar2 >> 0x20));
    if (iVar1 == 0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int deflt_get_params(void *provctx, OSSL_PARAM params[])
{
    OSSL_PARAM *p;

    p = OSSL_PARAM_locate(params, OSSL_PROV_PARAM_NAME);
    if (p != NULL && !OSSL_PARAM_set_utf8_ptr(p, "OpenSSL Default Provider"))
        return 0;
    p = OSSL_PARAM_locate(params, OSSL_PROV_PARAM_VERSION);
    if (p != NULL && !OSSL_PARAM_set_utf8_ptr(p, OPENSSL_VERSION_STR))
        return 0;
    p = OSSL_PARAM_locate(params, OSSL_PROV_PARAM_BUILDINFO);
    if (p != NULL && !OSSL_PARAM_set_utf8_ptr(p, OPENSSL_FULL_VERSION_STR))
        return 0;
    p = OSSL_PARAM_locate(params, OSSL_PROV_PARAM_STATUS);
    if (p != NULL && !OSSL_PARAM_set_int(p, ossl_prov_is_running()))
        return 0;
    return 1;
}